

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NonMaximumSuppression_PickTop::MergeFrom
          (NonMaximumSuppression_PickTop *this,NonMaximumSuppression_PickTop *from)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NonMaximumSuppression.pb.cc"
               ,0xc6);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->perclass_ == true) {
    this->perclass_ = true;
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void NonMaximumSuppression_PickTop::MergeFrom(const NonMaximumSuppression_PickTop& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NonMaximumSuppression.PickTop)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_perclass() != 0) {
    _internal_set_perclass(from._internal_perclass());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}